

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall
NEST::LArNEST::GetERElectronYieldsAlpha(LArNEST *this,double efield,double density)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double density_local;
  double efield_local;
  LArNEST *this_local;
  
  dVar1 = (this->fER).alpha.A;
  dVar2 = (this->fER).alpha.B;
  dVar3 = (this->fER).alpha.C;
  dVar6 = (this->fER).alpha.D;
  dVar4 = (this->fER).alpha.E;
  dVar5 = exp(density / (this->fER).alpha.F);
  dVar6 = pow(efield / (dVar4 * dVar5 + dVar6),(this->fER).alpha.G);
  return dVar1 + dVar2 / (dVar3 + dVar6);
}

Assistant:

double LArNEST::GetERElectronYieldsAlpha(double efield, double density) {
  return fER.alpha.A +
         fER.alpha.B / (fER.alpha.C +
                        pow(efield / (fER.alpha.D +
                                      fER.alpha.E * exp(density / fER.alpha.F)),
                            fER.alpha.G));
}